

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,StringData *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  StringData sdata;
  StringData local_48;
  
  if (value != (StringData *)0x0) {
    paVar1 = &local_48.value.field_2;
    local_48.value._M_string_length = 0;
    local_48.value.field_2._M_local_buf[0] = '\0';
    local_48.is_triple_quoted = false;
    local_48.single_quote = false;
    local_48.line_row = 0;
    local_48.line_col = 0;
    local_48.value._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = MaybeTripleQuotedString(this,&local_48);
    if ((bVar2) || (bVar2 = MaybeString(this,&local_48), bVar2)) {
      ::std::__cxx11::string::_M_assign((string *)value);
      value->line_col = local_48.line_col;
      value->is_triple_quoted = (bool)local_48.is_triple_quoted;
      value->single_quote = (bool)local_48.single_quote;
      *(undefined2 *)&value->field_0x22 = local_48._34_2_;
      value->line_row = local_48.line_row;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.value._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.value._M_dataplus._M_p,
                      CONCAT71(local_48.value.field_2._M_allocated_capacity._1_7_,
                               local_48.value.field_2._M_local_buf[0]) + 1);
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool AsciiParser::ReadBasicType(value::StringData *value) {
  if (!value) {
    return false;
  }

  // May be triple-quoted string
  {
    value::StringData sdata;
    if (MaybeTripleQuotedString(&sdata)) {
      (*value) = sdata;
      return true;

    } else if (MaybeString(&sdata)) {
      (*value) = sdata;
      return true;
    }
  }

  return false;
}